

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TIntermNode * __thiscall
glslang::HlslParseContext::executeDeclaration
          (HlslParseContext *this,TSourceLoc *loc,TVariable *variable)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  TIntermSymbol *var;
  TIntermNode *pTVar3;
  
  iVar1 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])(variable);
  lVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x58))
                    ((long *)CONCAT44(extraout_var,iVar1));
  if ((*(byte *)(lVar2 + 8) & 0x7f) != 0) {
    return (TIntermNode *)0x0;
  }
  var = TIntermediate::addSymbol
                  ((this->super_TParseContextBase).super_TParseVersions.intermediate,variable,loc);
  pTVar3 = handleDeclare(this,loc,&var->super_TIntermTyped);
  return pTVar3;
}

Assistant:

TIntermNode* HlslParseContext::executeDeclaration(const TSourceLoc& loc, TVariable* variable)
{
  //
  // Identifier must be of type temporary.
  //
  TStorageQualifier qualifier = variable->getType().getQualifier().storage;
  if (qualifier != EvqTemporary)
      return nullptr;

  TIntermSymbol* intermSymbol = intermediate.addSymbol(*variable, loc);
  return handleDeclare(loc, intermSymbol);
}